

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b::BuildLogTestFirstWriteAddsSignature::~BuildLogTestFirstWriteAddsSignature
          (BuildLogTestFirstWriteAddsSignature *this)

{
  BuildLogTestFirstWriteAddsSignature *this_local;
  
  BuildLogTest::~BuildLogTest(&this->super_BuildLogTest);
  return;
}

Assistant:

TEST_F(BuildLogTest, FirstWriteAddsSignature) {
  const char kExpectedVersion[] = "# ninja log vX\n";
  const size_t kVersionPos = strlen(kExpectedVersion) - 2;  // Points at 'X'.

  BuildLog log;
  string contents, err;

  EXPECT_TRUE(log.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  log.Close();

  ASSERT_EQ(0, ReadFile(kTestFilename, &contents, &err));
  ASSERT_EQ("", err);
  if (contents.size() >= kVersionPos)
    contents[kVersionPos] = 'X';
  EXPECT_EQ(kExpectedVersion, contents);

  // Opening the file anew shouldn't add a second version string.
  EXPECT_TRUE(log.OpenForWrite(kTestFilename, *this, &err));
  ASSERT_EQ("", err);
  log.Close();

  contents.clear();
  ASSERT_EQ(0, ReadFile(kTestFilename, &contents, &err));
  ASSERT_EQ("", err);
  if (contents.size() >= kVersionPos)
    contents[kVersionPos] = 'X';
  EXPECT_EQ(kExpectedVersion, contents);
}